

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threading.cpp
# Opt level: O2

EncodeParams *
cinemo::threading::divideWork
          (vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *lw,long numThreads
          )

{
  undefined8 *puVar1;
  pointer ppLVar2;
  undefined1 auVar3 [16];
  ulong uVar4;
  long *plVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  ulong uVar9;
  pointer *this;
  
  auVar3._8_8_ = 0;
  auVar3._0_8_ = numThreads;
  uVar4 = SUB168(auVar3 * ZEXT816(0x28),0);
  uVar9 = uVar4 + 8;
  if (0xfffffffffffffff7 < uVar4) {
    uVar9 = 0xffffffffffffffff;
  }
  uVar4 = 0xffffffffffffffff;
  if (SUB168(auVar3 * ZEXT816(0x28),8) == 0) {
    uVar4 = uVar9;
  }
  plVar5 = (long *)operator_new__(uVar4);
  *plVar5 = numThreads;
  if (numThreads != 0) {
    lVar7 = 0;
    do {
      *(undefined2 *)((long)plVar5 + lVar7 + 0xc) = 0;
      *(undefined1 *)((long)plVar5 + lVar7 + 0xe) = 0;
      *(undefined4 *)((long)plVar5 + lVar7 + 0x10) = 3;
      *(undefined8 *)((long)plVar5 + lVar7 + 0x28) = 0;
      puVar1 = (undefined8 *)((long)plVar5 + lVar7 + 0x18);
      *puVar1 = 0;
      puVar1[1] = 0;
      lVar7 = lVar7 + 0x28;
    } while (numThreads * 0x28 - lVar7 != 0);
  }
  uVar9 = 0;
  if (numThreads < 1) {
    numThreads = uVar9;
  }
LAB_001071e3:
  do {
    iVar6 = (int)uVar9;
    uVar9 = (ulong)iVar6;
    if ((ulong)((long)(lw->
                      super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(lw->
                      super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) <= uVar9) {
      return (EncodeParams *)(plVar5 + 1);
    }
    lVar7 = uVar9 * 8;
    this = (pointer *)(plVar5 + 3);
    for (lVar8 = 0; -lVar8 != numThreads; lVar8 = lVar8 + -1) {
      ppLVar2 = (lw->
                super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>).
                _M_impl.super__Vector_impl_data._M_start;
      if ((ulong)((long)(lw->
                        super__Vector_base<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>
                        )._M_impl.super__Vector_impl_data._M_finish - (long)ppLVar2 >> 3) <= uVar9)
      {
        uVar9 = (ulong)(uint)(iVar6 - (int)lVar8);
        goto LAB_001071e3;
      }
      uVar9 = uVar9 + 1;
      std::vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_>::push_back
                ((vector<cinemo::LameWrapper_*,_std::allocator<cinemo::LameWrapper_*>_> *)this,
                 (value_type *)((long)ppLVar2 + lVar7));
      this = this + 5;
      lVar7 = lVar7 + 8;
    }
    uVar9 = (ulong)(uint)((int)numThreads + iVar6);
  } while( true );
}

Assistant:

static EncodeParams* divideWork(const vector<LameWrapper*>& lw,
                                      long numThreads) {
            EncodeParams* wp = new EncodeParams[numThreads];
            int ja = 0; //Jobs Assigned

            while (ja < lw.size()) {
                for (int i = 0; i < numThreads && ja < lw.size(); ++i) {
                    wp[i].works.push_back(lw[ja++]);
                }
            }

            return wp;
        }